

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  _func_void_int_int *p_Var3;
  char *__s1;
  ImGuiWindow **ppIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  int iVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  byte bVar13;
  ImU32 key;
  ImVec2 in_RAX;
  ImGuiContext *g;
  ImGuiWindow *pIVar14;
  ImGuiWindow **ppIVar15;
  unsigned_short *__dest;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  char *label;
  long lVar19;
  int iVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    p_Var3 = (GImGui->IO).ImeSetInputScreenPosFn;
    local_38 = in_RAX;
    if ((p_Var3 != (_func_void_int_int *)0x0) &&
       (fVar22 = (GImGui->PlatformImePos).x, fVar23 = (GImGui->PlatformImeLastPos).x - fVar22,
       fVar24 = (GImGui->PlatformImeLastPos).y - (GImGui->PlatformImePos).y,
       0.0001 < fVar23 * fVar23 + fVar24 * fVar24)) {
      (*p_Var3)((int)fVar22,(int)(GImGui->PlatformImePos).y);
      pIVar11->PlatformImeLastPos = pIVar11->PlatformImePos;
    }
    if (1 < (pIVar11->CurrentWindowStack).Size) {
      iVar17 = (pIVar11->CurrentWindowStack).Size;
      while (1 < iVar17) {
        End();
        iVar17 = (pIVar11->CurrentWindowStack).Size;
      }
    }
    pIVar11->FrameScopePushedImplicitWindow = false;
    pIVar14 = pIVar11->CurrentWindow;
    if ((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->WriteAccessed == false)) {
      pIVar14->Active = false;
    }
    End();
    pIVar12 = GImGui;
    if ((pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
        key = ImHash("###NavWindowingList",0,0);
        pIVar14 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
        pIVar12->NavWindowingList = pIVar14;
      }
      pIVar9 = GImGui;
      (GImGui->NextWindowData).SizeConstraintCond = 1;
      IVar2 = (pIVar12->IO).DisplaySize;
      IVar7.y = IVar2.y * 0.2;
      IVar7.x = IVar2.x * 0.2;
      (pIVar9->NextWindowData).SizeConstraintRect.Min = IVar7;
      (pIVar9->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar9->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar9->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar9->NextWindowData).SizeCallbackUserData = (void *)0x0;
      IVar2 = (pIVar12->IO).DisplaySize;
      IVar8.y = IVar2.y * 0.5;
      IVar8.x = IVar2.x * 0.5;
      (pIVar9->NextWindowData).PosVal = IVar8;
      (pIVar9->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar9->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar9->NextWindowData).PosCond = 1;
      IVar2 = (pIVar12->Style).WindowPadding;
      fVar22 = IVar2.x;
      fVar23 = IVar2.y;
      local_38.y = fVar23 + fVar23;
      local_38.x = fVar22 + fVar22;
      PushStyleVar(1,&local_38);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar19 = (long)(pIVar12->WindowsFocusOrder).Size;
      if (0 < lVar19) {
        do {
          pIVar14 = (pIVar12->WindowsFocusOrder).Data[lVar19 + -1];
          if (((pIVar14->Active == true) && (pIVar14->RootWindow == pIVar14)) &&
             (uVar16 = pIVar14->Flags, (uVar16 >> 0x13 & 1) == 0)) {
            __s1 = pIVar14->Name;
            pcVar18 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar18 == '#') {
                  if (pcVar18[1] == '#') goto LAB_001285f7;
                }
                else if (*pcVar18 == '\0') goto LAB_001285f7;
                pcVar18 = pcVar18 + 1;
              } while (pcVar18 != (char *)0xffffffffffffffff);
              pcVar18 = (char *)0xffffffffffffffff;
            }
LAB_001285f7:
            label = __s1;
            if ((__s1 == pcVar18) && (label = "(Popup)", (uVar16 >> 0x1a & 1) == 0)) {
              if ((uVar16 >> 10 & 1) != 0) {
                iVar17 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar17 == 0) goto LAB_0012862e;
              }
              label = "(Untitled)";
            }
LAB_0012862e:
            local_38.x = 0.0;
            local_38.y = 0.0;
            Selectable(label,pIVar12->NavWindowingTarget == pIVar14,0,&local_38);
          }
          bVar6 = 1 < lVar19;
          lVar19 = lVar19 + -1;
        } while (bVar6);
      }
      End();
      PopStyleVar(1);
    }
    if (pIVar11->DragDropActive == true) {
      if ((pIVar11->DragDropPayload).DataFrameCount + 1 < pIVar11->FrameCount) {
        bVar13 = 1;
        if ((pIVar11->DragDropSourceFlags & 0x20) == 0) {
          bVar13 = (GImGui->IO).MouseDown[pIVar11->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar13 = 0;
      }
      if ((bVar13 != 0) || ((pIVar11->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if ((pIVar11->DragDropActive == true) &&
       (pIVar11->DragDropSourceFrameCount < pIVar11->FrameCount)) {
      pIVar11->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      pIVar11->DragDropWithinSourceOrTarget = false;
    }
    pIVar11->FrameScopeActive = false;
    pIVar11->FrameCountEnded = pIVar11->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar17 = (pIVar11->WindowsSortBuffer).Capacity;
    if (iVar17 < 0) {
      uVar16 = iVar17 / 2 + iVar17;
      uVar21 = 0;
      if (0 < (int)uVar16) {
        uVar21 = (ulong)uVar16;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar21 * 8,GImAllocatorUserData);
      ppIVar4 = (pIVar11->WindowsSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar15,ppIVar4,(long)(pIVar11->WindowsSortBuffer).Size << 3);
        ppIVar4 = (pIVar11->WindowsSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar11->WindowsSortBuffer).Data = ppIVar15;
      (pIVar11->WindowsSortBuffer).Capacity = (int)uVar21;
    }
    (pIVar11->WindowsSortBuffer).Size = 0;
    iVar17 = (pIVar11->Windows).Size;
    if ((pIVar11->WindowsSortBuffer).Capacity < iVar17) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar17 << 3,GImAllocatorUserData);
      ppIVar4 = (pIVar11->WindowsSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar15,ppIVar4,(long)(pIVar11->WindowsSortBuffer).Size << 3);
        ppIVar4 = (pIVar11->WindowsSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar11->WindowsSortBuffer).Data = ppIVar15;
      (pIVar11->WindowsSortBuffer).Capacity = iVar17;
    }
    uVar16 = (pIVar11->Windows).Size;
    if (uVar16 != 0) {
      uVar21 = 0;
      do {
        pIVar14 = (pIVar11->Windows).Data[uVar21];
        if ((pIVar14->Active != true) || ((pIVar14->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar11->WindowsSortBuffer,pIVar14);
        }
        uVar21 = uVar21 + 1;
        uVar16 = (pIVar11->Windows).Size;
      } while (uVar21 != uVar16);
    }
    iVar17 = (pIVar11->Windows).Capacity;
    iVar20 = (pIVar11->WindowsSortBuffer).Size;
    iVar10 = (pIVar11->WindowsSortBuffer).Capacity;
    ppIVar15 = (pIVar11->WindowsSortBuffer).Data;
    (pIVar11->WindowsSortBuffer).Size = uVar16;
    (pIVar11->WindowsSortBuffer).Capacity = iVar17;
    ppIVar4 = (pIVar11->Windows).Data;
    (pIVar11->Windows).Size = iVar20;
    (pIVar11->Windows).Capacity = iVar10;
    (pIVar11->Windows).Data = ppIVar15;
    (pIVar11->WindowsSortBuffer).Data = ppIVar4;
    (pIVar11->IO).MetricsActiveWindows = pIVar11->WindowsActiveCount;
    ((pIVar11->IO).Fonts)->Locked = false;
    (pIVar11->IO).MouseWheel = 0.0;
    (pIVar11->IO).MouseWheelH = 0.0;
    iVar17 = (pIVar11->IO).InputQueueCharacters.Capacity;
    if (iVar17 < 0) {
      iVar17 = iVar17 / 2 + iVar17;
      iVar20 = 0;
      if (0 < iVar17) {
        iVar20 = iVar17;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar20 * 2),GImAllocatorUserData);
      puVar5 = (pIVar11->IO).InputQueueCharacters.Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar11->IO).InputQueueCharacters.Size * 2);
        puVar5 = (pIVar11->IO).InputQueueCharacters.Data;
        if ((puVar5 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar11->IO).InputQueueCharacters.Data = __dest;
      (pIVar11->IO).InputQueueCharacters.Capacity = iVar20;
    }
    (pIVar11->IO).InputQueueCharacters.Size = 0;
    (pIVar11->IO).NavInputs[0] = 0.0;
    (pIVar11->IO).NavInputs[1] = 0.0;
    (pIVar11->IO).NavInputs[2] = 0.0;
    (pIVar11->IO).NavInputs[3] = 0.0;
    (pIVar11->IO).NavInputs[4] = 0.0;
    (pIVar11->IO).NavInputs[5] = 0.0;
    (pIVar11->IO).NavInputs[6] = 0.0;
    (pIVar11->IO).NavInputs[7] = 0.0;
    (pIVar11->IO).NavInputs[8] = 0.0;
    (pIVar11->IO).NavInputs[9] = 0.0;
    (pIVar11->IO).NavInputs[10] = 0.0;
    (pIVar11->IO).NavInputs[0xb] = 0.0;
    (pIVar11->IO).NavInputs[0xc] = 0.0;
    (pIVar11->IO).NavInputs[0xd] = 0.0;
    (pIVar11->IO).NavInputs[0xe] = 0.0;
    (pIVar11->IO).NavInputs[0xf] = 0.0;
    (pIVar11->IO).NavInputs[0x10] = 0.0;
    (pIVar11->IO).NavInputs[0x11] = 0.0;
    (pIVar11->IO).NavInputs[0x12] = 0.0;
    (pIVar11->IO).NavInputs[0x13] = 0.0;
    (pIVar11->IO).NavInputs[0x14] = 0.0;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}